

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

bool __thiscall ON_BrepRegionTopology::Write(ON_BrepRegionTopology *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_21;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_BrepRegionTopology *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar1) {
    local_21 = ON_BrepFaceSideArray::Write(&this->m_FS,file);
    if (local_21) {
      local_21 = ON_BrepRegionArray::Write(&this->m_R,file);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BrepRegionTopology::Write( ON_BinaryArchive& file) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;
  for(;;)
  {
    rc = m_FS.Write(file);
    if (!rc) break;
    rc = m_R.Write(file);
    if (!rc) break;

    break;
  }
  if ( !file.EndWrite3dmChunk() )
    rc = false;
  return rc;
}